

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

bool __thiscall
banksia::ChessBoard::isLegalMove(ChessBoard *this,int from,int dest,PieceType promotion)

{
  Side SVar1;
  bool bVar2;
  Piece PVar3;
  PieceType in_ECX;
  int in_EDX;
  int in_ESI;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *in_RDI;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> moveList;
  Piece piece;
  PieceType in_stack_00000078;
  int in_stack_0000007c;
  int in_stack_00000080;
  Side in_stack_00000084;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *in_stack_00000088;
  ChessBoard *in_stack_00000090;
  BoardCore *in_stack_ffffffffffffff88;
  byte local_61;
  Side SStack_28;
  Piece local_24;
  PieceType local_1c;
  byte local_1;
  
  local_1c = in_ECX;
  bVar2 = Move::isValid(in_ESI,in_EDX);
  if (bVar2) {
    local_24 = BoardCore::getPiece(in_stack_ffffffffffffff88,0);
    bVar2 = Piece::isEmpty(&local_24);
    local_61 = 1;
    if (!bVar2) {
      SVar1 = local_24.side;
      PVar3 = BoardCore::getPiece(in_stack_ffffffffffffff88,0);
      SStack_28 = PVar3.side;
      local_61 = 1;
      if (SVar1 != SStack_28) {
        bVar2 = BoardCore::isValidPromotion(local_1c);
        local_61 = bVar2 ^ 0xff;
      }
    }
    if ((local_61 & 1) == 0) {
      std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::vector
                ((vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)0x1e926e);
      genLegal(in_stack_00000090,in_stack_00000088,in_stack_00000084,in_stack_00000080,
               in_stack_0000007c,in_stack_00000078);
      bVar2 = std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::empty(in_RDI);
      local_1 = (bVar2 ^ 0xffU) & 1;
      std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::~vector(in_RDI);
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ChessBoard::isLegalMove(int from, int dest, PieceType promotion)
{
    if (!MoveFull::isValid(from, dest)) {
        return false;
    }
    auto piece = getPiece(from);
    if (piece.isEmpty()
        || piece.side == getPiece(dest).side
        || !isValidPromotion(promotion)) {
        return false;
    }
    
    std::vector<MoveFull> moveList;
    genLegal(moveList, piece.side, from, dest, promotion);
    return !moveList.empty();
}